

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

void __thiscall
Parser_parseModelWithComponentHierarchyWaterfall_Test::
~Parser_parseModelWithComponentHierarchyWaterfall_Test
          (Parser_parseModelWithComponentHierarchyWaterfall_Test *this)

{
  Parser_parseModelWithComponentHierarchyWaterfall_Test *this_local;
  
  ~Parser_parseModelWithComponentHierarchyWaterfall_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Parser, parseModelWithComponentHierarchyWaterfall)
{
    const std::string e =
        "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
        "<model xmlns=\"http://www.cellml.org/cellml/2.0#\">\n"
        "  <component name=\"dave\"/>\n"
        "  <component name=\"bob\"/>\n"
        "  <component name=\"angus\"/>\n"
        "  <encapsulation>\n"
        "    <component_ref component=\"dave\">\n"
        "      <component_ref component=\"bob\">\n"
        "        <component_ref component=\"angus\"/>\n"
        "      </component_ref>\n"
        "    </component_ref>\n"
        "  </encapsulation>\n"
        "</model>\n";

    libcellml::ParserPtr parser = libcellml::Parser::create();
    libcellml::ModelPtr model = parser->parseModel(e);

    libcellml::PrinterPtr printer = libcellml::Printer::create();
    const std::string a = printer->printModel(model);
    EXPECT_EQ(e, a);
}